

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSUnload(UConverterSharedData *sharedData)

{
  UConverterMBCSTable *mbcsTable;
  UConverterSharedData *sharedData_local;
  
  if ((sharedData->mbcs).swapLFNLStateTable != (int32_t (*) [256])0x0) {
    uprv_free_63((sharedData->mbcs).swapLFNLStateTable);
  }
  if ((sharedData->mbcs).stateTableOwned != '\0') {
    uprv_free_63((sharedData->mbcs).stateTable);
  }
  if ((sharedData->mbcs).baseSharedData != (UConverterSharedData *)0x0) {
    ucnv_unload_63((sharedData->mbcs).baseSharedData);
  }
  if ((sharedData->mbcs).reconstitutedData != (uint8_t *)0x0) {
    uprv_free_63((sharedData->mbcs).reconstitutedData);
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSUnload(UConverterSharedData *sharedData) {
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;

    if(mbcsTable->swapLFNLStateTable!=NULL) {
        uprv_free(mbcsTable->swapLFNLStateTable);
    }
    if(mbcsTable->stateTableOwned) {
        uprv_free((void *)mbcsTable->stateTable);
    }
    if(mbcsTable->baseSharedData!=NULL) {
        ucnv_unload(mbcsTable->baseSharedData);
    }
    if(mbcsTable->reconstitutedData!=NULL) {
        uprv_free(mbcsTable->reconstitutedData);
    }
}